

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall
Number_N10DefaultBase10_Test<wchar_t>::~Number_N10DefaultBase10_Test
          (Number_N10DefaultBase10_Test<wchar_t> *this)

{
  Number_N10DefaultBase10_Test<wchar_t> *this_local;
  
  ~Number_N10DefaultBase10_Test(this);
  operator_delete(this,400);
  return;
}

Assistant:

TYPED_TEST (Number, N10DefaultBase10) {
    pstore::dump::number_base::dec ();
    pstore::dump::number_long v (10, 10);
    v.write (this->out_);
    auto const & actual = this->out_.str ();
    auto const & expected = convert<TypeParam> ("10");
    EXPECT_EQ (expected, actual);
}